

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O2

string * __thiscall
ObservationModelDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,ObservationModelDiscrete *this)

{
  ostream *poVar1;
  int s_ip;
  int iVar2;
  ulong uVar3;
  int jo_i;
  uint uVar4;
  int ja_i;
  int iVar5;
  ulong uVar6;
  double dVar7;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  dVar7 = (double)std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"jo\tja\ts\'\tP (tuples with P==0 are not printed)");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar4 = 0; (int)uVar4 < this->_m_nrJointObservations; uVar4 = uVar4 + 1) {
    uVar6 = 0;
    while (iVar5 = (int)uVar6, iVar5 < this->_m_nrJointActions) {
      uVar3 = 0;
      while (iVar2 = (int)uVar3, iVar2 < this->_m_nrStates) {
        (*(this->super_ObservationModelDiscreteInterface).super_ObservationModel.
          _vptr_ObservationModel[4])(this,uVar6,uVar3,(ulong)uVar4);
        if (0.0 < dVar7) {
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar4);
          poVar1 = std::operator<<(poVar1,"\t");
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar5);
          poVar1 = std::operator<<(poVar1,"\t");
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
          std::operator<<(poVar1,"\t");
          poVar1 = std::ostream::_M_insert<double>(dVar7);
          std::endl<char,std::char_traits<char>>(poVar1);
        }
        uVar3 = (ulong)(iVar2 + 1);
      }
      uVar6 = (ulong)(iVar5 + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string ObservationModelDiscrete::SoftPrint() const
{
    stringstream ss;
    double p;
    ss << "jo\tja\ts'\tP (tuples with P==0 are not printed)"<<endl;
    for(int jo_i = 0; jo_i < _m_nrJointObservations; jo_i++)
        for(int ja_i = 0; ja_i < _m_nrJointActions; ja_i++)
            for(int s_ip = 0; s_ip < _m_nrStates; s_ip++)
            {
                p=Get(ja_i, s_ip, jo_i);
                if(p>0)
                    ss << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" << p
                         << endl;
            }
    return(ss.str());
}